

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XMLURL::XMLURL(XMLURL *this,XMLURL *toCopy)

{
  MemoryManager *manager;
  Protocols PVar1;
  XMLCh *pXVar2;
  CleanupType_conflict6 cleanup;
  JanitorMemFunCall<xercesc_4_0::XMLURL> local_28;
  
  this->_vptr_XMLURL = (_func_int **)&PTR__XMLURL_003fb4d0;
  manager = toCopy->fMemoryManager;
  this->fMemoryManager = manager;
  this->fFragment = (XMLCh *)0x0;
  this->fHost = (XMLCh *)0x0;
  this->fPassword = (XMLCh *)0x0;
  this->fPath = (XMLCh *)0x0;
  PVar1 = toCopy->fProtocol;
  this->fPortNum = toCopy->fPortNum;
  this->fProtocol = PVar1;
  this->fQuery = (XMLCh *)0x0;
  this->fUser = (XMLCh *)0x0;
  this->fURLText = (XMLCh *)0x0;
  this->fHasInvalidChar = toCopy->fHasInvalidChar;
  local_28.fToCall = (MFPT)cleanUp;
  local_28._16_8_ = 0;
  local_28.fObject = this;
  pXVar2 = XMLString::replicate(toCopy->fFragment,manager);
  this->fFragment = pXVar2;
  pXVar2 = XMLString::replicate(toCopy->fHost,this->fMemoryManager);
  this->fHost = pXVar2;
  pXVar2 = XMLString::replicate(toCopy->fPassword,this->fMemoryManager);
  this->fPassword = pXVar2;
  pXVar2 = XMLString::replicate(toCopy->fPath,this->fMemoryManager);
  this->fPath = pXVar2;
  pXVar2 = XMLString::replicate(toCopy->fQuery,this->fMemoryManager);
  this->fQuery = pXVar2;
  pXVar2 = XMLString::replicate(toCopy->fUser,this->fMemoryManager);
  this->fUser = pXVar2;
  pXVar2 = XMLString::replicate(toCopy->fURLText,this->fMemoryManager);
  this->fURLText = pXVar2;
  local_28.fObject = (XMLURL *)0x0;
  JanitorMemFunCall<xercesc_4_0::XMLURL>::~JanitorMemFunCall(&local_28);
  return;
}

Assistant:

XMLURL::XMLURL(const XMLURL& toCopy) :
    XMemory(toCopy)
    , fMemoryManager(toCopy.fMemoryManager)
    , fFragment(0)
    , fHost(0)
    , fPassword(0)
    , fPath(0)
    , fPortNum(toCopy.fPortNum)
    , fProtocol(toCopy.fProtocol)
    , fQuery(0)
    , fUser(0)
    , fURLText(0)
    , fHasInvalidChar(toCopy.fHasInvalidChar)
{
    CleanupType cleanup(this, &XMLURL::cleanUp);

    try
    {
        fFragment = XMLString::replicate(toCopy.fFragment, fMemoryManager);
        fHost = XMLString::replicate(toCopy.fHost, fMemoryManager);
        fPassword = XMLString::replicate(toCopy.fPassword, fMemoryManager);
        fPath = XMLString::replicate(toCopy.fPath, fMemoryManager);
        fQuery = XMLString::replicate(toCopy.fQuery, fMemoryManager);
        fUser = XMLString::replicate(toCopy.fUser, fMemoryManager);
        fURLText = XMLString::replicate(toCopy.fURLText, fMemoryManager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}